

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::Integrator::setDynamicalSystem
          (Integrator *this,shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *dynamicalSystem)

{
  int iVar1;
  
  if ((this->m_dynamicalSystem_ptr).
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    iDynTree::reportError
              ((((this->m_info).m_data.
                 super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->name)._M_dataplus._M_p,"setDynamicalSystem",
               "Change dynamical system is forbidden.");
    return false;
  }
  (this->m_dynamicalSystem_ptr).
  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (dynamicalSystem->
       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_dynamicalSystem_ptr).
              super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(dynamicalSystem->
              super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  iVar1 = (*this->_vptr_Integrator[0xf])(this);
  return SUB41(iVar1,0);
}

Assistant:

bool Integrator::setDynamicalSystem(const std::shared_ptr<DynamicalSystem> dynamicalSystem)
            {
                if (m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "setDynamicalSystem", "Change dynamical system is forbidden."); //I want to prevent the change of dynamical system between two iterations of an eventual optimal control problem. This change would not be detected and would cause problems of dimensions.
                    return false;
                }

                m_dynamicalSystem_ptr = dynamicalSystem;

                return allocateBuffers();
            }